

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ulong uVar34;
  ulong uVar35;
  byte bVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  float fVar45;
  float fVar49;
  float fVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  vint4 bi;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  float fVar77;
  undefined1 auVar76 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  uint uVar85;
  uint uVar86;
  uint uVar87;
  undefined1 auVar84 [64];
  undefined1 auVar88 [64];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_a2c;
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  RayQueryContext *local_9f0;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  long local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong *local_990;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  int *local_958;
  undefined8 local_950;
  RTCRayQueryContext *local_948;
  Ray *local_940;
  undefined4 *local_938;
  undefined4 local_930;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar45 = ray->tfar;
    if (0.0 <= fVar45) {
      local_9f0 = context;
      local_990 = local_7d0;
      aVar3 = (ray->dir).field_0;
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75 = vandps_avx((undefined1  [16])aVar3,auVar75);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar75,auVar78,1);
      auVar75 = vblendvps_avx((undefined1  [16])aVar3,auVar78,auVar75);
      auVar78 = vrcpps_avx(auVar75);
      fVar49 = auVar78._0_4_;
      auVar72._0_4_ = fVar49 * auVar75._0_4_;
      fVar50 = auVar78._4_4_;
      auVar72._4_4_ = fVar50 * auVar75._4_4_;
      fVar51 = auVar78._8_4_;
      auVar72._8_4_ = fVar51 * auVar75._8_4_;
      fVar77 = auVar78._12_4_;
      auVar72._12_4_ = fVar77 * auVar75._12_4_;
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = 0x3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar75 = vsubps_avx(auVar79,auVar72);
      auVar73._0_4_ = fVar49 + fVar49 * auVar75._0_4_;
      auVar73._4_4_ = fVar50 + fVar50 * auVar75._4_4_;
      auVar73._8_4_ = fVar51 + fVar51 * auVar75._8_4_;
      auVar73._12_4_ = fVar77 + fVar77 * auVar75._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_8a8._4_4_ = uVar2;
      local_8a8._0_4_ = uVar2;
      local_8a8._8_4_ = uVar2;
      local_8a8._12_4_ = uVar2;
      auVar81 = ZEXT1664(local_8a8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8b8._4_4_ = uVar2;
      local_8b8._0_4_ = uVar2;
      local_8b8._8_4_ = uVar2;
      local_8b8._12_4_ = uVar2;
      auVar82 = ZEXT1664(local_8b8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8c8._4_4_ = uVar2;
      local_8c8._0_4_ = uVar2;
      local_8c8._8_4_ = uVar2;
      local_8c8._12_4_ = uVar2;
      auVar83 = ZEXT1664(local_8c8);
      local_8d8 = vshufps_avx(auVar73,auVar73,0);
      auVar84 = ZEXT1664(local_8d8);
      auVar75 = vmovshdup_avx(auVar73);
      local_8e8 = vshufps_avx(auVar73,auVar73,0x55);
      auVar88 = ZEXT1664(local_8e8);
      auVar78 = vshufpd_avx(auVar73,auVar73,1);
      local_8f8 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar74 = ZEXT1664(local_8f8);
      local_998 = (ulong)(auVar73._0_4_ < 0.0) << 4;
      uVar42 = (ulong)(auVar75._0_4_ < 0.0) << 4 | 0x20;
      uVar40 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x40;
      uVar43 = local_998 ^ 0x10;
      local_908 = vshufps_avx(auVar46,auVar46,0);
      auVar76 = ZEXT1664(local_908);
      local_918 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
      auVar80 = ZEXT1664(local_918);
      local_928 = mm_lookupmask_ps._240_16_;
LAB_002bdd70:
      do {
        uVar44 = local_990[-1];
        local_990 = local_990 + -1;
        while ((uVar44 & 8) == 0) {
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + local_998),auVar81._0_16_);
          auVar46._0_4_ = auVar84._0_4_ * auVar75._0_4_;
          auVar46._4_4_ = auVar84._4_4_ * auVar75._4_4_;
          auVar46._8_4_ = auVar84._8_4_ * auVar75._8_4_;
          auVar46._12_4_ = auVar84._12_4_ * auVar75._12_4_;
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar42),auVar82._0_16_);
          auVar52._0_4_ = auVar88._0_4_ * auVar75._0_4_;
          auVar52._4_4_ = auVar88._4_4_ * auVar75._4_4_;
          auVar52._8_4_ = auVar88._8_4_ * auVar75._8_4_;
          auVar52._12_4_ = auVar88._12_4_ * auVar75._12_4_;
          auVar75 = vpmaxsd_avx(auVar46,auVar52);
          auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar40),auVar83._0_16_);
          auVar53._0_4_ = auVar74._0_4_ * auVar46._0_4_;
          auVar53._4_4_ = auVar74._4_4_ * auVar46._4_4_;
          auVar53._8_4_ = auVar74._8_4_ * auVar46._8_4_;
          auVar53._12_4_ = auVar74._12_4_ * auVar46._12_4_;
          auVar46 = vpmaxsd_avx(auVar53,auVar76._0_16_);
          auVar75 = vpmaxsd_avx(auVar75,auVar46);
          auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar43),auVar81._0_16_);
          auVar54._0_4_ = auVar84._0_4_ * auVar46._0_4_;
          auVar54._4_4_ = auVar84._4_4_ * auVar46._4_4_;
          auVar54._8_4_ = auVar84._8_4_ * auVar46._8_4_;
          auVar54._12_4_ = auVar84._12_4_ * auVar46._12_4_;
          auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar42 ^ 0x10)),
                               auVar82._0_16_);
          auVar64._0_4_ = auVar88._0_4_ * auVar46._0_4_;
          auVar64._4_4_ = auVar88._4_4_ * auVar46._4_4_;
          auVar64._8_4_ = auVar88._8_4_ * auVar46._8_4_;
          auVar64._12_4_ = auVar88._12_4_ * auVar46._12_4_;
          auVar46 = vpminsd_avx(auVar54,auVar64);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar40 ^ 0x10)),
                               auVar83._0_16_);
          auVar65._0_4_ = auVar74._0_4_ * auVar78._0_4_;
          auVar65._4_4_ = auVar74._4_4_ * auVar78._4_4_;
          auVar65._8_4_ = auVar74._8_4_ * auVar78._8_4_;
          auVar65._12_4_ = auVar74._12_4_ * auVar78._12_4_;
          auVar78 = vpminsd_avx(auVar65,auVar80._0_16_);
          auVar46 = vpminsd_avx(auVar46,auVar78);
          auVar75 = vpcmpgtd_avx(auVar75,auVar46);
          iVar37 = vmovmskps_avx(auVar75);
          if (iVar37 == 0xf) {
            if (local_990 == &local_7d8) {
              return;
            }
            goto LAB_002bdd70;
          }
          bVar36 = (byte)iVar37 ^ 0xf;
          uVar34 = uVar44 & 0xfffffffffffffff0;
          lVar39 = 0;
          if (bVar36 != 0) {
            for (; (bVar36 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar44 = *(ulong *)(uVar34 + lVar39 * 8);
          uVar41 = bVar36 - 1 & (uint)bVar36;
          if (uVar41 != 0) {
            *local_990 = uVar44;
            local_990 = local_990 + 1;
            lVar39 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            uVar44 = *(ulong *)(uVar34 + lVar39 * 8);
            uVar41 = uVar41 - 1 & uVar41;
            uVar38 = (ulong)uVar41;
            if (uVar41 != 0) {
              do {
                *local_990 = uVar44;
                local_990 = local_990 + 1;
                lVar39 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                uVar44 = *(ulong *)(uVar34 + lVar39 * 8);
                uVar38 = uVar38 & uVar38 - 1;
              } while (uVar38 != 0);
            }
          }
        }
        local_9a0 = (ulong)((uint)uVar44 & 0xf) - 8;
        if (local_9a0 != 0) {
          uVar44 = uVar44 & 0xfffffffffffffff0;
          local_9a8 = 0;
          do {
            lVar39 = local_9a8 * 0xb0;
            pfVar1 = (float *)(uVar44 + 0x80 + lVar39);
            fVar14 = *pfVar1;
            fVar15 = pfVar1[1];
            fVar16 = pfVar1[2];
            fVar17 = pfVar1[3];
            pfVar1 = (float *)(uVar44 + 0x40 + lVar39);
            fVar18 = *pfVar1;
            fVar19 = pfVar1[1];
            fVar20 = pfVar1[2];
            fVar21 = pfVar1[3];
            auVar47._0_4_ = fVar14 * fVar18;
            auVar47._4_4_ = fVar15 * fVar19;
            auVar47._8_4_ = fVar16 * fVar20;
            auVar47._12_4_ = fVar17 * fVar21;
            pfVar1 = (float *)(uVar44 + 0x70 + lVar39);
            fVar22 = *pfVar1;
            fVar23 = pfVar1[1];
            fVar24 = pfVar1[2];
            fVar25 = pfVar1[3];
            pfVar1 = (float *)(uVar44 + 0x50 + lVar39);
            fVar26 = *pfVar1;
            fVar27 = pfVar1[1];
            fVar28 = pfVar1[2];
            fVar29 = pfVar1[3];
            auVar55._0_4_ = fVar22 * fVar26;
            auVar55._4_4_ = fVar23 * fVar27;
            auVar55._8_4_ = fVar24 * fVar28;
            auVar55._12_4_ = fVar25 * fVar29;
            local_9c8 = vsubps_avx(auVar55,auVar47);
            auVar75 = *(undefined1 (*) [16])(uVar44 + 0x60 + lVar39);
            fVar89 = auVar75._0_4_;
            auVar56._0_4_ = fVar89 * fVar26;
            fVar90 = auVar75._4_4_;
            auVar56._4_4_ = fVar90 * fVar27;
            fVar91 = auVar75._8_4_;
            auVar56._8_4_ = fVar91 * fVar28;
            fVar92 = auVar75._12_4_;
            auVar56._12_4_ = fVar92 * fVar29;
            pfVar1 = (float *)(uVar44 + 0x30 + lVar39);
            fVar30 = *pfVar1;
            fVar31 = pfVar1[1];
            fVar32 = pfVar1[2];
            fVar33 = pfVar1[3];
            auVar66._0_4_ = fVar14 * fVar30;
            auVar66._4_4_ = fVar15 * fVar31;
            auVar66._8_4_ = fVar16 * fVar32;
            auVar66._12_4_ = fVar17 * fVar33;
            local_a18 = vsubps_avx(auVar66,auVar56);
            auVar67._0_4_ = fVar22 * fVar30;
            auVar67._4_4_ = fVar23 * fVar31;
            auVar67._8_4_ = fVar24 * fVar32;
            auVar67._12_4_ = fVar25 * fVar33;
            auVar93._0_4_ = fVar89 * fVar18;
            auVar93._4_4_ = fVar90 * fVar19;
            auVar93._8_4_ = fVar91 * fVar20;
            auVar93._12_4_ = fVar92 * fVar21;
            local_a08 = vsubps_avx(auVar93,auVar67);
            uVar2 = *(undefined4 *)&(ray->org).field_0;
            auVar94._4_4_ = uVar2;
            auVar94._0_4_ = uVar2;
            auVar94._8_4_ = uVar2;
            auVar94._12_4_ = uVar2;
            local_9d8 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + lVar39),auVar94);
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar95._4_4_ = uVar2;
            auVar95._0_4_ = uVar2;
            auVar95._8_4_ = uVar2;
            auVar95._12_4_ = uVar2;
            local_a28 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x10 + lVar39),auVar95);
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar96._4_4_ = uVar2;
            auVar96._0_4_ = uVar2;
            auVar96._8_4_ = uVar2;
            auVar96._12_4_ = uVar2;
            local_9e8 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + lVar39),auVar96);
            fVar45 = (ray->dir).field_0.m128[1];
            fVar49 = (ray->dir).field_0.m128[2];
            fVar51 = local_9e8._0_4_;
            auVar97._0_4_ = fVar45 * fVar51;
            fVar5 = local_9e8._4_4_;
            auVar97._4_4_ = fVar45 * fVar5;
            fVar8 = local_9e8._8_4_;
            auVar97._8_4_ = fVar45 * fVar8;
            fVar11 = local_9e8._12_4_;
            auVar97._12_4_ = fVar45 * fVar11;
            fVar77 = local_a28._0_4_;
            auVar98._0_4_ = fVar49 * fVar77;
            fVar6 = local_a28._4_4_;
            auVar98._4_4_ = fVar49 * fVar6;
            fVar9 = local_a28._8_4_;
            auVar98._8_4_ = fVar49 * fVar9;
            fVar12 = local_a28._12_4_;
            auVar98._12_4_ = fVar49 * fVar12;
            auVar46 = vsubps_avx(auVar98,auVar97);
            fVar50 = (ray->dir).field_0.m128[0];
            fVar4 = local_9d8._0_4_;
            auVar48._0_4_ = fVar49 * fVar4;
            fVar7 = local_9d8._4_4_;
            auVar48._4_4_ = fVar49 * fVar7;
            fVar10 = local_9d8._8_4_;
            auVar48._8_4_ = fVar49 * fVar10;
            fVar13 = local_9d8._12_4_;
            auVar48._12_4_ = fVar49 * fVar13;
            auVar57._0_4_ = fVar50 * fVar51;
            auVar57._4_4_ = fVar50 * fVar5;
            auVar57._8_4_ = fVar50 * fVar8;
            auVar57._12_4_ = fVar50 * fVar11;
            auVar78 = vsubps_avx(auVar57,auVar48);
            auVar58._0_4_ = fVar50 * fVar77;
            auVar58._4_4_ = fVar50 * fVar6;
            auVar58._8_4_ = fVar50 * fVar9;
            auVar58._12_4_ = fVar50 * fVar12;
            auVar68._0_4_ = fVar45 * fVar4;
            auVar68._4_4_ = fVar45 * fVar7;
            auVar68._8_4_ = fVar45 * fVar10;
            auVar68._12_4_ = fVar45 * fVar13;
            auVar72 = vsubps_avx(auVar68,auVar58);
            auVar79 = local_a08;
            auVar73 = local_a18;
            auVar69._0_4_ =
                 local_9c8._0_4_ * fVar50 + fVar45 * local_a18._0_4_ + fVar49 * local_a08._0_4_;
            auVar69._4_4_ =
                 local_9c8._4_4_ * fVar50 + fVar45 * local_a18._4_4_ + fVar49 * local_a08._4_4_;
            auVar69._8_4_ =
                 local_9c8._8_4_ * fVar50 + fVar45 * local_a18._8_4_ + fVar49 * local_a08._8_4_;
            auVar69._12_4_ =
                 local_9c8._12_4_ * fVar50 + fVar45 * local_a18._12_4_ + fVar49 * local_a08._12_4_;
            auVar59._8_8_ = 0x8000000080000000;
            auVar59._0_8_ = 0x8000000080000000;
            auVar75 = vandps_avx(auVar69,auVar59);
            uVar41 = auVar75._0_4_;
            local_898._0_4_ =
                 (float)(uVar41 ^ (uint)(fVar89 * auVar46._0_4_ +
                                        fVar14 * auVar72._0_4_ + fVar22 * auVar78._0_4_));
            uVar85 = auVar75._4_4_;
            local_898._4_4_ =
                 (float)(uVar85 ^ (uint)(fVar90 * auVar46._4_4_ +
                                        fVar15 * auVar72._4_4_ + fVar23 * auVar78._4_4_));
            uVar86 = auVar75._8_4_;
            local_898._8_4_ =
                 (float)(uVar86 ^ (uint)(fVar91 * auVar46._8_4_ +
                                        fVar16 * auVar72._8_4_ + fVar24 * auVar78._8_4_));
            uVar87 = auVar75._12_4_;
            local_898._12_4_ =
                 (float)(uVar87 ^ (uint)(fVar92 * auVar46._12_4_ +
                                        fVar17 * auVar72._12_4_ + fVar25 * auVar78._12_4_));
            local_888._0_4_ =
                 (float)(uVar41 ^ (uint)(fVar30 * auVar46._0_4_ +
                                        fVar26 * auVar72._0_4_ + fVar18 * auVar78._0_4_));
            local_888._4_4_ =
                 (float)(uVar85 ^ (uint)(fVar31 * auVar46._4_4_ +
                                        fVar27 * auVar72._4_4_ + fVar19 * auVar78._4_4_));
            local_888._8_4_ =
                 (float)(uVar86 ^ (uint)(fVar32 * auVar46._8_4_ +
                                        fVar28 * auVar72._8_4_ + fVar20 * auVar78._8_4_));
            local_888._12_4_ =
                 (float)(uVar87 ^ (uint)(fVar33 * auVar46._12_4_ +
                                        fVar29 * auVar72._12_4_ + fVar21 * auVar78._12_4_));
            auVar78 = ZEXT416(0) << 0x20;
            auVar75 = vcmpps_avx(local_898,auVar78,5);
            auVar46 = vcmpps_avx(local_888,auVar78,5);
            auVar75 = vandps_avx(auVar75,auVar46);
            auVar60._8_4_ = 0x7fffffff;
            auVar60._0_8_ = 0x7fffffff7fffffff;
            auVar60._12_4_ = 0x7fffffff;
            local_868 = vandps_avx(auVar69,auVar60);
            auVar46 = vcmpps_avx(auVar78,auVar69,4);
            auVar75 = vandps_avx(auVar75,auVar46);
            auVar61._0_4_ = local_898._0_4_ + local_888._0_4_;
            auVar61._4_4_ = local_898._4_4_ + local_888._4_4_;
            auVar61._8_4_ = local_898._8_4_ + local_888._8_4_;
            auVar61._12_4_ = local_898._12_4_ + local_888._12_4_;
            auVar46 = vcmpps_avx(auVar61,local_868,2);
            auVar75 = vandps_avx(auVar75,auVar46);
            auVar46 = local_928 & auVar75;
            if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar46[0xf] < '\0') {
              auVar75 = vandps_avx(auVar75,local_928);
              local_878._0_4_ =
                   (float)(uVar41 ^ (uint)(local_9c8._0_4_ * fVar4 +
                                          fVar77 * local_a18._0_4_ + fVar51 * local_a08._0_4_));
              local_878._4_4_ =
                   (float)(uVar85 ^ (uint)(local_9c8._4_4_ * fVar7 +
                                          fVar6 * local_a18._4_4_ + fVar5 * local_a08._4_4_));
              local_878._8_4_ =
                   (float)(uVar86 ^ (uint)(local_9c8._8_4_ * fVar10 +
                                          fVar9 * local_a18._8_4_ + fVar8 * local_a08._8_4_));
              local_878._12_4_ =
                   (float)(uVar87 ^ (uint)(local_9c8._12_4_ * fVar13 +
                                          fVar12 * local_a18._12_4_ + fVar11 * local_a08._12_4_));
              fVar45 = (ray->org).field_0.m128[3];
              fVar49 = local_868._0_4_;
              auVar62._0_4_ = fVar49 * fVar45;
              fVar50 = local_868._4_4_;
              auVar62._4_4_ = fVar50 * fVar45;
              fVar51 = local_868._8_4_;
              auVar62._8_4_ = fVar51 * fVar45;
              fVar77 = local_868._12_4_;
              auVar62._12_4_ = fVar77 * fVar45;
              auVar46 = vcmpps_avx(auVar62,local_878,1);
              fVar45 = ray->tfar;
              auVar70._0_4_ = fVar49 * fVar45;
              auVar70._4_4_ = fVar50 * fVar45;
              auVar70._8_4_ = fVar51 * fVar45;
              auVar70._12_4_ = fVar77 * fVar45;
              auVar78 = vcmpps_avx(local_878,auVar70,2);
              auVar46 = vandps_avx(auVar78,auVar46);
              local_848 = vandps_avx(auVar46,auVar75);
              uVar41 = vmovmskps_avx(local_848);
              if (uVar41 != 0) {
                local_808 = local_9c8;
                local_7f8 = local_a18._0_8_;
                uStack_7f0 = local_a18._8_8_;
                local_7e8 = local_a08._0_8_;
                uStack_7e0 = local_a08._8_8_;
                local_9c8._0_8_ = local_9f0->scene;
                auVar75 = vrcpps_avx(local_868);
                fVar45 = auVar75._0_4_;
                auVar63._0_4_ = fVar49 * fVar45;
                fVar49 = auVar75._4_4_;
                auVar63._4_4_ = fVar50 * fVar49;
                fVar50 = auVar75._8_4_;
                auVar63._8_4_ = fVar51 * fVar50;
                fVar51 = auVar75._12_4_;
                auVar63._12_4_ = fVar77 * fVar51;
                auVar71._8_4_ = 0x3f800000;
                auVar71._0_8_ = 0x3f8000003f800000;
                auVar71._12_4_ = 0x3f800000;
                auVar75 = vsubps_avx(auVar71,auVar63);
                fVar45 = fVar45 + fVar45 * auVar75._0_4_;
                fVar49 = fVar49 + fVar49 * auVar75._4_4_;
                fVar50 = fVar50 + fVar50 * auVar75._8_4_;
                fVar51 = fVar51 + fVar51 * auVar75._12_4_;
                local_818[0] = fVar45 * local_878._0_4_;
                local_818[1] = fVar49 * local_878._4_4_;
                local_818[2] = fVar50 * local_878._8_4_;
                local_818[3] = fVar51 * local_878._12_4_;
                local_838._0_4_ = fVar45 * local_898._0_4_;
                local_838._4_4_ = fVar49 * local_898._4_4_;
                local_838._8_4_ = fVar50 * local_898._8_4_;
                local_838._12_4_ = fVar51 * local_898._12_4_;
                local_828._0_4_ = fVar45 * local_888._0_4_;
                local_828._4_4_ = fVar49 * local_888._4_4_;
                local_828._8_4_ = fVar50 * local_888._8_4_;
                local_828._12_4_ = fVar51 * local_888._12_4_;
                uVar34 = (ulong)(uVar41 & 0xff);
                local_9d8._0_8_ = lVar39 + uVar44;
                lVar39 = lVar39 + uVar44;
                local_a18 = auVar73;
                local_a08 = auVar79;
                do {
                  local_a08._0_8_ = uVar34;
                  uVar38 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  local_a18._0_8_ = uVar38;
                  local_970 = *(uint *)(lVar39 + 0x90 + uVar38 * 4);
                  uVar35 = CONCAT44(0,local_970);
                  local_a28._0_8_ = uVar35;
                  local_9b0 = *(long *)(*(long *)(local_9c8._0_8_ + 0x1e8) + uVar35 * 8);
                  if ((*(uint *)(local_9b0 + 0x34) & ray->mask) == 0) {
                    uVar34 = uVar34 ^ 1L << (uVar38 & 0x3f);
                  }
                  else {
                    if ((local_9f0->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_a28._0_8_ = ray, *(long *)(local_9b0 + 0x48) == 0)) goto LAB_002be40b;
                    local_9e8._0_8_ = local_9f0->args;
                    local_948 = local_9f0->user;
                    local_988 = *(undefined4 *)(local_808 + uVar38 * 4);
                    local_984 = *(undefined4 *)((long)&local_7f8 + uVar38 * 4);
                    local_980 = *(undefined4 *)((long)&local_7e8 + uVar38 * 4);
                    local_97c = *(undefined4 *)(local_838 + uVar38 * 4);
                    local_978 = *(undefined4 *)(local_828 + uVar38 * 4);
                    local_974 = *(undefined4 *)(local_9d8._0_8_ + 0xa0 + uVar38 * 4);
                    local_96c = local_948->instID[0];
                    local_968 = local_948->instPrimID[0];
                    fVar45 = ray->tfar;
                    ray->tfar = local_818[uVar38];
                    local_a2c = -1;
                    local_958 = &local_a2c;
                    local_950 = *(undefined8 *)(local_9b0 + 0x18);
                    local_a28._0_8_ = ray;
                    local_938 = &local_988;
                    local_930 = 1;
                    local_940 = ray;
                    if ((*(code **)(local_9b0 + 0x48) == (code *)0x0) ||
                       ((**(code **)(local_9b0 + 0x48))(&local_958), *local_958 != 0)) {
                      if ((*(code **)(local_9e8._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_9e8._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_9b0 + 0x3e) & 0x40) == 0)))) {
LAB_002be40b:
                        ((Ray *)local_a28._0_8_)->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_9e8._0_8_ + 0x10))(&local_958);
                      if (*local_958 != 0) goto LAB_002be40b;
                    }
                    *(float *)(local_a28._0_8_ + 0x20) = fVar45;
                    uVar34 = local_a08._0_8_ ^ 1L << (local_a18._0_8_ & 0x3f);
                    ray = (Ray *)local_a28._0_8_;
                  }
                  lVar39 = local_9d8._0_8_;
                } while (uVar34 != 0);
              }
            }
            local_9a8 = local_9a8 + 1;
          } while (local_9a8 != local_9a0);
        }
        auVar81 = ZEXT1664(local_8a8);
        auVar82 = ZEXT1664(local_8b8);
        auVar83 = ZEXT1664(local_8c8);
        auVar84 = ZEXT1664(local_8d8);
        auVar88 = ZEXT1664(local_8e8);
        auVar74 = ZEXT1664(local_8f8);
        auVar76 = ZEXT1664(local_908);
        auVar80 = ZEXT1664(local_918);
      } while (local_990 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }